

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::find(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  bool bVar1;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_28;
  int local_1c;
  SparseArray<re2::NFA::Thread_*> *pSStack_18;
  int i_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  local_1c = i;
  pSStack_18 = this;
  bVar1 = has_index(this,i);
  if (bVar1) {
    local_28._M_current =
         (IndexValue *)
         std::
         vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
         ::begin(&this->dense_);
    this_local = (SparseArray<re2::NFA::Thread_*> *)
                 __gnu_cxx::
                 __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
                 ::operator+(&local_28,(long)this->sparse_to_dense_[local_1c]);
  }
  else {
    this_local = (SparseArray<re2::NFA::Thread_*> *)end(this);
  }
  return (iterator)(IndexValue *)this_local;
}

Assistant:

typename SparseArray<Value>::iterator SparseArray<Value>::find(int i) {
  if (has_index(i))
    return dense_.begin() + sparse_to_dense_[i];
  return end();
}